

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetRootProperty
              (Var instance,PropertyId propertyId,PropertyValueInfo *info,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *aValue;
  RecyclableObject *propertyObject;
  PropertyRecord *pPVar5;
  FunctionBody *pFVar6;
  JavascriptFunction *local_40;
  JavascriptFunction *caller;
  Var value;
  
  bVar2 = VarIs<Js::RootObjectBase>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x87c,"(VarIs<RootObjectBase>(instance))","Root must be an object!"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  caller = (JavascriptFunction *)0x0;
  aValue = VarTo<Js::RecyclableObject>(instance);
  propertyObject = VarTo<Js::RecyclableObject>(aValue);
  BVar3 = GetProperty_Internal<false>
                    (aValue,propertyObject,true,propertyId,&caller,scriptContext,info);
  if (BVar3 == 0) {
    pPVar5 = ScriptContext::GetPropertyName(scriptContext,propertyId);
    pPVar5 = pPVar5 + 1;
    local_40 = (JavascriptFunction *)0x0;
    BVar3 = JavascriptStackWalker::GetCaller(&local_40,scriptContext);
    if (((BVar3 != 0) &&
        (pFVar6 = JavascriptFunction::GetFunctionBody(local_40), pFVar6 != (FunctionBody *)0x0)) &&
       ((((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
         field_0xa8 & 8) != 0)) {
      pPVar5 = (PropertyRecord *)0x0;
    }
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar2) {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec6f,(PCWSTR)pPVar5);
    }
    caller = (JavascriptFunction *)ScriptContext::GetMissingPropertyResult(scriptContext);
  }
  else if (((JavascriptFunction *)
            (((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).
            ptr == caller) &&
          (bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext), bVar2)) {
    JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
  }
  return caller;
}

Assistant:

Var JavascriptOperators::OP_GetRootProperty(Var instance, PropertyId propertyId, PropertyValueInfo * info, ScriptContext* scriptContext)
    {
        AssertMsg(VarIs<RootObjectBase>(instance), "Root must be an object!");

        Var value = nullptr;
        if (JavascriptOperators::GetRootProperty(VarTo<RecyclableObject>(instance), propertyId, &value, scriptContext, info))
        {
            if (scriptContext->IsUndeclBlockVar(value) && scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }

        const char16* propertyName = scriptContext->GetPropertyName(propertyId)->GetBuffer();

        JavascriptFunction * caller = nullptr;
        if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
        {
            FunctionBody * callerBody = caller->GetFunctionBody();
            if (callerBody && callerBody->GetUtf8SourceInfo()->GetIsXDomain())
            {
                propertyName = nullptr;
            }
        }

        // Don't error if we disabled implicit calls
        if (scriptContext->GetThreadContext()->RecordImplicitException())
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UndefVariable, propertyName);
        }

        return scriptContext->GetMissingPropertyResult();
    }